

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O3

_Bool int_loop(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  gravity_object_t *closure;
  undefined1 *puVar1;
  _Bool _Var2;
  gravity_fiber_t *fiber;
  nanotime_t nVar3;
  nanotime_t nVar4;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar5;
  gravity_value_t value;
  gravity_value_t gVar6;
  char _buffer [4096];
  gravity_value_t local_1048;
  char local_1038 [4];
  char acStack_1034 [4];
  char acStack_1030 [4];
  char acStack_102c [4];
  undefined4 uStack_1028;
  undefined3 uStack_1024;
  undefined5 uStack_1021;
  undefined3 uStack_101c;
  
  if (nargs < 2) {
    uStack_1028 = 0x20666f20;
    uStack_1024 = 0x677261;
    uStack_1021 = 0x746e656d75;
    uStack_101c = 0x2e73;
    local_1038[0] = 'I';
    local_1038[1] = 'n';
    local_1038[2] = 'c';
    local_1038[3] = 'o';
    acStack_1034[0] = 'r';
    acStack_1034[1] = 'r';
    acStack_1034[2] = 'e';
    acStack_1034[3] = 'c';
    acStack_1030[0] = 't';
    acStack_1030[1] = ' ';
    acStack_1030[2] = 'n';
    acStack_1030[3] = 'u';
    acStack_102c[0] = 'm';
    acStack_102c[1] = 'b';
    acStack_102c[2] = 'e';
    acStack_102c[3] = 'r';
  }
  else {
    if (args[1].isa == gravity_class_closure) {
      closure = args[1].field_1.p;
      puVar1 = (undefined1 *)(args->field_1).n;
      gVar6 = *args;
      nVar3 = nanotime();
      if (0 < (long)puVar1) {
        aVar5.n = 0;
        do {
          local_1048.isa = gravity_class_int;
          local_1048.field_1 = aVar5;
          _Var2 = gravity_vm_runclosure(vm,(gravity_closure_t *)closure,gVar6,&local_1048,1);
          if (!_Var2) {
            return false;
          }
          aVar5.p = (gravity_object_t *)((long)&(aVar5.p)->isa + 1);
        } while (puVar1 != (undefined1 *)aVar5.n);
      }
      nVar4 = nanotime();
      gVar6.field_1.p = (gravity_object_t *)(nVar4 - nVar3);
      gVar6.isa = gravity_class_int;
      gravity_vm_setslot(vm,gVar6,rindex);
      return true;
    }
    uStack_1028 = 0x43206120;
    uStack_1024 = 0x736f6c;
    uStack_1021 = 0x2e657275;
    local_1038[0] = 'A';
    local_1038[1] = 'r';
    local_1038[2] = 'g';
    local_1038[3] = 'u';
    acStack_1034[0] = 'm';
    acStack_1034[1] = 'e';
    acStack_1034[2] = 'n';
    acStack_1034[3] = 't';
    acStack_1030[0] = ' ';
    acStack_1030[1] = 'm';
    acStack_1030[2] = 'u';
    acStack_1030[3] = 's';
    acStack_102c[0] = 't';
    acStack_102c[1] = ' ';
    acStack_102c[2] = 'b';
    acStack_102c[3] = 'e';
  }
  fiber = gravity_vm_fiber(vm);
  gravity_fiber_seterror(fiber,local_1038);
  value.field_1.n = 0;
  value.isa = gravity_class_null;
  gravity_vm_setslot(vm,value,rindex);
  return false;
}

Assistant:

static bool int_loop (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    if (nargs < 2) RETURN_ERROR("Incorrect number of arguments.");
    if (!VALUE_ISA_CLOSURE(GET_VALUE(1))) RETURN_ERROR("Argument must be a Closure.");

    gravity_closure_t *closure = VALUE_AS_CLOSURE(GET_VALUE(1));    // closure to execute
    gravity_value_t value = GET_VALUE(0);                           // self parameter
    register gravity_int_t n = value.n;                             // times to execute the loop
    register gravity_int_t i = 0;

    nanotime_t t1 = nanotime();
    while (i < n) {
        if (!gravity_vm_runclosure(vm, closure, value, &VALUE_FROM_INT(i), 1)) return false;
        ++i;
    }
    nanotime_t t2 = nanotime();
    RETURN_VALUE(VALUE_FROM_INT(t2-t1), rindex);
}